

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O0

size_t HUF_compressCTable_internal
                 (BYTE *ostart,BYTE *op,BYTE *oend,void *src,size_t srcSize,
                 HUF_nbStreams_e nbStreams,HUF_CElt *CTable,int flags)

{
  uint uVar1;
  BYTE *local_50;
  size_t cSize;
  HUF_nbStreams_e nbStreams_local;
  size_t srcSize_local;
  void *src_local;
  BYTE *oend_local;
  BYTE *op_local;
  BYTE *ostart_local;
  
  if (nbStreams == HUF_singleStream) {
    local_50 = (BYTE *)HUF_compress1X_usingCTable_internal
                                 (op,(long)oend - (long)op,src,srcSize,CTable,flags);
  }
  else {
    local_50 = (BYTE *)HUF_compress4X_usingCTable_internal
                                 (op,(long)oend - (long)op,src,srcSize,CTable,flags);
  }
  uVar1 = ERR_isError((size_t)local_50);
  if (uVar1 == 0) {
    if (local_50 == (BYTE *)0x0) {
      ostart_local = (BYTE *)0x0;
    }
    else {
      local_50 = local_50 + (long)op;
      if (local_50 < ostart) {
        __assert_fail("op >= ostart",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                      ,0x4b3,
                      "size_t HUF_compressCTable_internal(BYTE *const, BYTE *, BYTE *const, const void *, size_t, HUF_nbStreams_e, const HUF_CElt *, const int)"
                     );
      }
      if ((ulong)((long)local_50 - (long)ostart) < srcSize - 1) {
        ostart_local = local_50 + -(long)ostart;
      }
      else {
        ostart_local = (BYTE *)0x0;
      }
    }
  }
  else {
    ostart_local = local_50;
  }
  return (size_t)ostart_local;
}

Assistant:

static size_t HUF_compressCTable_internal(
                BYTE* const ostart, BYTE* op, BYTE* const oend,
                const void* src, size_t srcSize,
                HUF_nbStreams_e nbStreams, const HUF_CElt* CTable, const int flags)
{
    size_t const cSize = (nbStreams==HUF_singleStream) ?
                         HUF_compress1X_usingCTable_internal(op, (size_t)(oend - op), src, srcSize, CTable, flags) :
                         HUF_compress4X_usingCTable_internal(op, (size_t)(oend - op), src, srcSize, CTable, flags);
    if (HUF_isError(cSize)) { return cSize; }
    if (cSize==0) { return 0; }   /* uncompressible */
    op += cSize;
    /* check compressibility */
    assert(op >= ostart);
    if ((size_t)(op-ostart) >= srcSize-1) { return 0; }
    return (size_t)(op-ostart);
}